

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htentry.cpp
# Opt level: O2

void __thiscall HotRingInstance::hrHead::inc_counter(hrHead *this)

{
  ulong uVar1;
  
  uVar1 = 0;
  if ((long)this->head < 0) {
    uVar1 = 0x8000000000000000;
  }
  this->head = (htEntry *)
               (uVar1 | (ulong)&this->head[0x33333333333].key.field_2 & 0x7fffffffffffffff);
  return;
}

Assistant:

void hrHead::inc_counter(){
            size_t ptr = reinterpret_cast<size_t>(head);
            bool active = ptr & (1l << 63l);
            ptr += inc_base;
            // 先置空，不然下面的位运算在进位时会出现问题
            ptr &= ~(1l << 63l);

            if(active){
                ptr |= (1l << 63l);
            }

            head = reinterpret_cast<htEntry*>(ptr);
        }